

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Initialize(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             *this)

{
  HeapAllocator *this_00;
  Memory *this_01;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar1;
  char *name;
  DictionaryStats *pDVar2;
  TrackAllocData local_38;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *local_10;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  
  this->disableResize = false;
  this->free = (EntryType *)0x0;
  this_00 = this->allocator;
  local_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&SimpleHashEntry<void*,Memory::Recycler::PinRecord>*::typeinfo,0
             ,(ulong)this->size,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
             ,0x41);
  this_01 = (Memory *)Memory::HeapAllocator::TrackAllocInfo(this_00,&local_38);
  ppSVar1 = Memory::
            AllocateArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*,false>
                      (this_01,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,(ulong)this->size
                      );
  this->table = ppSVar1;
  name = std::type_info::name
                   ((type_info *)
                    &SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>*
                     ::typeinfo);
  pDVar2 = DictionaryStats::Create(name,this->size);
  this->stats = pDVar2;
  return;
}

Assistant:

void Initialize()
    {
        disableResize = false;
        free = nullptr;
        table = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, size);
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
    }